

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndication_Init.cpp
# Opt level: O0

bool __thiscall
SRUP_MSG_SYNDICATION_INIT::DeSerialize(SRUP_MSG_SYNDICATION_INIT *this,uint8_t *serial_data)

{
  uint16_t uVar1;
  uint64_t *puVar2;
  uint8_t *puVar3;
  char *pcVar4;
  uint8_t *encrypted_data;
  uchar *snd_byte;
  uint8_t *__end1_1;
  uint8_t *__begin1_1;
  uint8_t (*__range1_1) [8];
  uint8_t snd_bytes [8];
  uchar *sid_byte;
  uint8_t *__end1;
  uint8_t *__begin1;
  uint8_t (*__range1) [8];
  uint8_t sid_bytes [8];
  uint8_t bytes [2];
  uint32_t p;
  uint16_t x;
  uint8_t *serial_data_local;
  SRUP_MSG_SYNDICATION_INIT *this_local;
  
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_version = *serial_data;
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_msgtype = serial_data[1];
  sid_bytes[2] = '\x02';
  sid_bytes[3] = '\0';
  sid_bytes[4] = '\0';
  sid_bytes[5] = '\0';
  for (__end1 = (uint8_t *)((long)&__range1 + 6); __end1 != sid_bytes; __end1 = __end1 + 1) {
    snd_bytes = (uint8_t  [8])__end1;
    *__end1 = serial_data[(uint)sid_bytes._2_4_];
    sid_bytes._2_4_ = sid_bytes._2_4_ + 1;
  }
  if (((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID != (uint64_t *)0x0) &&
     (puVar2 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID,
     puVar2 != (uint64_t *)0x0)) {
    operator_delete(puVar2);
  }
  puVar2 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID = puVar2;
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sequence_ID = stack0xffffffffffffffd6;
  for (__end1_1 = (uint8_t *)&__range1_1; __end1_1 != snd_bytes; __end1_1 = __end1_1 + 1) {
    *__end1_1 = serial_data[(uint)sid_bytes._2_4_];
    sid_bytes._2_4_ = sid_bytes._2_4_ + 1;
  }
  if (((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID != (uint64_t *)0x0) &&
     (puVar2 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID, puVar2 != (uint64_t *)0x0
     )) {
    operator_delete(puVar2);
  }
  puVar2 = (uint64_t *)operator_new(8);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID = puVar2;
  *(this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sender_ID = (uint64_t)__range1_1;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  puVar3 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token;
  if (puVar3 != (uint8_t *)0x0) {
    operator_delete__(puVar3);
  }
  puVar3 = (uint8_t *)operator_new__((ulong)uVar1);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token = puVar3;
  memcpy((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token,serial_data + (uint)sid_bytes._2_4_,
         (ulong)uVar1);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_token_len = uVar1;
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_sig_len = uVar1;
  puVar3 = (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature;
  if (puVar3 != (uint8_t *)0x0) {
    operator_delete__(puVar3);
  }
  puVar3 = (uint8_t *)operator_new__((ulong)uVar1);
  (this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature = puVar3;
  memcpy((this->super_SRUP_MSG_OBS_BASE).super_SRUP_MSG.m_signature,
         serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  if (this->m_url != (char *)0x0) {
    operator_delete__(this->m_url);
  }
  pcVar4 = (char *)operator_new__((long)(int)(uVar1 + 1));
  this->m_url = pcVar4;
  memcpy(this->m_url,serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  this->m_url[(int)(uint)uVar1] = '\0';
  this->m_url_len = uVar1;
  sid_bytes._2_4_ = (uint)uVar1 + sid_bytes._2_4_;
  sid_bytes._0_2_ = *(undefined2 *)(serial_data + (uint)sid_bytes._2_4_);
  uVar1 = SRUP_MSG::decodeLength(sid_bytes);
  sid_bytes._2_4_ = sid_bytes._2_4_ + 2;
  pcVar4 = (char *)operator_new__((ulong)uVar1);
  memcpy(pcVar4,serial_data + (uint)sid_bytes._2_4_,(ulong)uVar1);
  SRUP_Crypto::crypt((this->super_SRUP_MSG_OBS_BASE).m_crypto,pcVar4,(char *)(ulong)uVar1);
  if (pcVar4 != (char *)0x0) {
    operator_delete__(pcVar4);
  }
  return true;
}

Assistant:

bool SRUP_MSG_SYNDICATION_INIT::DeSerialize (const uint8_t *serial_data)
{
    uint16_t x;
    uint32_t p=0;
    uint8_t bytes[2];

    // We need to unmarshall the data to reconstruct the object...
    // We can start with the two bytes for the header.
    // One for the version - and one for the message type.

    std::memcpy(m_version, (uint8_t*) serial_data, 1);
    p+=1;
    std::memcpy(m_msgtype, (uint8_t*) serial_data + p, 1);
    p+=1;

    // Now we have to unmarshall the sequence ID...
    // Reconstructing it from the 8x uint8_t's we have in the bytestream...
    // First we get the 8-bytes...
    uint8_t sid_bytes[8];
    for (unsigned char & sid_byte : sid_bytes)
    {
        std::memcpy(&sid_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sequence_ID
    if (m_sequence_ID != nullptr)
        delete(m_sequence_ID);
    m_sequence_ID = new uint64_t;
    std::memcpy(m_sequence_ID, sid_bytes, 8);

    // Again we have to do the same trick to unmarshall the sender ID...
    // Reconstructing it from the 8x uint8_t's we have in the bytestream...
    uint8_t snd_bytes[8];
    for (unsigned char & snd_byte : snd_bytes)
    {
        std::memcpy(&snd_byte, (uint8_t*) serial_data + p, 1);
        ++p;
    }

    // ... then we copy them into m_sender_ID
    if (m_sender_ID != nullptr)
        delete(m_sender_ID);
    m_sender_ID = new uint64_t;
    std::memcpy(m_sender_ID, snd_bytes, 8);

    // Now the token - the last of the "generic" fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_token;
    m_token = new uint8_t[x];
    std::memcpy(m_token, (uint8_t *) serial_data + p, x);
    m_token_len = x;
    p+=x;

    // Most of the rest of the fields are simpler...

    // The next two bytes are the size of the signature...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    m_sig_len = x;

    // The next x bytes are the value of the signature.
    delete[] m_signature;
    m_signature = new uint8_t[x];
    std::memcpy(m_signature, serial_data + p, x);

    p+=x;

    // Now finally on to the remaining (simple) fields...
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;
    delete[] m_url;
    m_url = new char[x+1];
    std::memcpy(m_url, (uint8_t *) serial_data + p, x);
    *(m_url + x) = 0;
    m_url_len = x;
    p+=x;

    // Lastly we have the encrypted data.
    std::memcpy(bytes, serial_data + p, 2);
    x = decodeLength(bytes);
    p+=2;

    auto* encrypted_data = new uint8_t[x];

    std::memcpy(encrypted_data, (uint8_t *) serial_data + p, x);
    m_crypto->crypt(encrypted_data, x);

    delete[] encrypted_data;

    return true;
}